

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::Service>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::Service> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> OVar1;
  TableKeyComparator<reflection::Service> local_20;
  
  local_20.buf_ = &this->buf_;
  std::
  stable_sort<flatbuffers::Offset<reflection::Service>*,flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<reflection::Service>>
            (v,v + len,&local_20);
  OVar1 = CreateVector<reflection::Service>(this,v,len);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVectorOfSortedTables(Offset<T> *v,
                                                       size_t len) {
    std::stable_sort(v, v + len, TableKeyComparator<T>(buf_));
    return CreateVector(v, len);
  }